

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool opening_token(Env *env,uint32_t i)

{
  int32_t iVar1;
  _Bool _Var2;
  
  iVar1 = peek(env,1);
  _Var2 = true;
  if ((((0x39 < iVar1 - 0x22U) || ((0x200000000000041U >> ((ulong)(iVar1 - 0x22U) & 0x3f) & 1) == 0)
       ) && (iVar1 != 0x2987)) && (iVar1 != 0x27e6)) {
    if (iVar1 != 0x7b) {
      _Var2 = is_id_char(iVar1);
      return _Var2;
    }
    iVar1 = peek(env,2);
    _Var2 = iVar1 != 0x2d;
  }
  return _Var2;
}

Assistant:

static bool opening_token(Env *env, uint32_t i) {
  int32_t c = peek(env, i);
  switch (c) {
    case 0x27e6: // ⟦
    case 0x2987: // ⦇
    case '(':
    case '[':
    case '"':
      return true;
    case '{':
      return peek(env, i + 1) != '-';
    default:
      // Includes single quote
      return is_id_char(c);
  }
}